

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O0

UChar * __thiscall
icu_63::TZGNCore::getGenericLocationName(TZGNCore *this,UnicodeString *tzCanonicalID)

{
  UnicodeString *this_00;
  UBool UVar1;
  int32_t iVar2;
  UChar *pUVar3;
  undefined4 *value;
  UChar *local_2b0;
  GNameInfo *nameinfo;
  UChar *cacheID;
  undefined1 local_260 [8];
  UnicodeString city;
  UnicodeString country;
  char local_1d5;
  int32_t ccLen;
  undefined1 local_1d0 [3];
  char countryCode [4];
  UBool isPrimary;
  UnicodeString usCountryCode;
  UnicodeString name;
  UChar *locname;
  Char16Ptr local_138;
  int32_t local_12c;
  char16_t local_128 [2];
  int32_t tzIDKeyLen;
  UChar tzIDKey [129];
  UErrorCode status;
  UnicodeString *tzCanonicalID_local;
  TZGNCore *this_local;
  
  unique0x100005bd = tzCanonicalID;
  iVar2 = UnicodeString::length(tzCanonicalID);
  this_00 = stack0xffffffffffffffe0;
  if (0x80 < iVar2) {
    return (UChar *)0x0;
  }
  tzIDKey[0x7e] = L'\0';
  tzIDKey[0x7f] = L'\0';
  Char16Ptr::Char16Ptr(&local_138,local_128);
  iVar2 = UnicodeString::extract(this_00,&local_138,0x81,(UErrorCode *)(tzIDKey + 0x7e));
  Char16Ptr::~Char16Ptr(&local_138);
  local_128[iVar2] = L'\0';
  local_12c = iVar2;
  pUVar3 = (UChar *)uhash_get_63(this->fLocationNamesMap,local_128);
  if (pUVar3 != (UChar *)0x0) {
    if (pUVar3 != L"") {
      return pUVar3;
    }
    return (UChar *)0x0;
  }
  UnicodeString::UnicodeString((UnicodeString *)((long)&usCountryCode.fUnion + 0x30));
  UnicodeString::UnicodeString((UnicodeString *)local_1d0);
  ccLen._3_1_ = '\0';
  ZoneMeta::getCanonicalCountry
            (stack0xffffffffffffffe0,(UnicodeString *)local_1d0,(UBool *)((long)&ccLen + 3));
  UVar1 = UnicodeString::isEmpty((UnicodeString *)local_1d0);
  if (UVar1 == '\0') {
    if (ccLen._3_1_ == '\0') {
      UnicodeString::UnicodeString((UnicodeString *)local_260);
      (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[0xb])
                (this->fTimeZoneNames,stack0xffffffffffffffe0,local_260);
      SimpleFormatter::format
                (&this->fRegionFormat,(UnicodeString *)local_260,
                 (UnicodeString *)((long)&usCountryCode.fUnion + 0x30),
                 (UErrorCode *)(tzIDKey + 0x7e));
      UnicodeString::~UnicodeString((UnicodeString *)local_260);
    }
    else {
      iVar2 = UnicodeString::length((UnicodeString *)local_1d0);
      iVar2 = UnicodeString::extract((UnicodeString *)local_1d0,0,iVar2,&local_1d5,4,kInvariant);
      (&local_1d5)[iVar2] = '\0';
      UnicodeString::UnicodeString((UnicodeString *)((long)&city.fUnion + 0x30));
      (*(this->fLocaleDisplayNames->super_UObject)._vptr_UObject[0xb])
                (this->fLocaleDisplayNames,&local_1d5,(undefined1 *)((long)&city.fUnion + 0x30));
      SimpleFormatter::format
                (&this->fRegionFormat,(UnicodeString *)((long)&city.fUnion + 0x30),
                 (UnicodeString *)((long)&usCountryCode.fUnion + 0x30),
                 (UErrorCode *)(tzIDKey + 0x7e));
      UnicodeString::~UnicodeString((UnicodeString *)((long)&city.fUnion + 0x30));
    }
    UVar1 = ::U_FAILURE(tzIDKey._252_4_);
    if (UVar1 != '\0') {
      this_local = (TZGNCore *)0x0;
      goto LAB_0023ea0d;
    }
  }
  UVar1 = UnicodeString::isEmpty((UnicodeString *)((long)&usCountryCode.fUnion + 0x30));
  if (UVar1 == '\0') {
    local_2b0 = ZNStringPool::get(&this->fStringPool,
                                  (UnicodeString *)((long)&usCountryCode.fUnion + 0x30),
                                  (UErrorCode *)(tzIDKey + 0x7e));
  }
  else {
    local_2b0 = (UChar *)0x0;
  }
  name.fUnion._48_8_ = local_2b0;
  UVar1 = ::U_SUCCESS(tzIDKey._252_4_);
  if (UVar1 != '\0') {
    pUVar3 = ZoneMeta::findTimeZoneID(stack0xffffffffffffffe0);
    if (local_2b0 == (UChar *)0x0) {
      uhash_put_63(this->fLocationNamesMap,pUVar3,&gEmpty,(UErrorCode *)(tzIDKey + 0x7e));
    }
    else {
      uhash_put_63(this->fLocationNamesMap,pUVar3,local_2b0,(UErrorCode *)(tzIDKey + 0x7e));
      UVar1 = ::U_FAILURE(tzIDKey._252_4_);
      if (UVar1 == '\0') {
        value = (undefined4 *)uprv_malloc_63(0x10);
        if (value != (undefined4 *)0x0) {
          *value = 1;
          *(UChar **)(value + 2) = pUVar3;
          TextTrieMap::put(&this->fGNamesTrie,local_2b0,value,(UErrorCode *)(tzIDKey + 0x7e));
        }
      }
      else {
        name.fUnion._48_8_ = 0;
      }
    }
  }
  this_local = (TZGNCore *)name.fUnion._48_8_;
LAB_0023ea0d:
  UnicodeString::~UnicodeString((UnicodeString *)local_1d0);
  UnicodeString::~UnicodeString((UnicodeString *)((long)&usCountryCode.fUnion + 0x30));
  return (UChar *)this_local;
}

Assistant:

const UChar*
TZGNCore::getGenericLocationName(const UnicodeString& tzCanonicalID) {
    U_ASSERT(!tzCanonicalID.isEmpty());
    if (tzCanonicalID.length() > ZID_KEY_MAX) {
        return NULL;
    }

    UErrorCode status = U_ZERO_ERROR;
    UChar tzIDKey[ZID_KEY_MAX + 1];
    int32_t tzIDKeyLen = tzCanonicalID.extract(tzIDKey, ZID_KEY_MAX + 1, status);
    U_ASSERT(status == U_ZERO_ERROR);   // already checked length above
    tzIDKey[tzIDKeyLen] = 0;

    const UChar *locname = (const UChar *)uhash_get(fLocationNamesMap, tzIDKey);

    if (locname != NULL) {
        // gEmpty indicate the name is not available
        if (locname == gEmpty) {
            return NULL;
        }
        return locname;
    }

    // Construct location name
    UnicodeString name;
    UnicodeString usCountryCode;
    UBool isPrimary = FALSE;

    ZoneMeta::getCanonicalCountry(tzCanonicalID, usCountryCode, &isPrimary);

    if (!usCountryCode.isEmpty()) {
        if (isPrimary) {
            // If this is the primary zone in the country, use the country name.
            char countryCode[ULOC_COUNTRY_CAPACITY];
            U_ASSERT(usCountryCode.length() < ULOC_COUNTRY_CAPACITY);
            int32_t ccLen = usCountryCode.extract(0, usCountryCode.length(), countryCode, sizeof(countryCode), US_INV);
            countryCode[ccLen] = 0;

            UnicodeString country;
            fLocaleDisplayNames->regionDisplayName(countryCode, country);
            fRegionFormat.format(country, name, status);
        } else {
            // If this is not the primary zone in the country,
            // use the exemplar city name.

            // getExemplarLocationName should retur non-empty string
            // if the time zone is associated with a region

            UnicodeString city;
            fTimeZoneNames->getExemplarLocationName(tzCanonicalID, city);
            fRegionFormat.format(city, name, status);
        }
        if (U_FAILURE(status)) {
            return NULL;
        }
    }

    locname = name.isEmpty() ? NULL : fStringPool.get(name, status);
    if (U_SUCCESS(status)) {
        // Cache the result
        const UChar* cacheID = ZoneMeta::findTimeZoneID(tzCanonicalID);
        U_ASSERT(cacheID != NULL);
        if (locname == NULL) {
            // gEmpty to indicate - no location name available
            uhash_put(fLocationNamesMap, (void *)cacheID, (void *)gEmpty, &status);
        } else {
            uhash_put(fLocationNamesMap, (void *)cacheID, (void *)locname, &status);
            if (U_FAILURE(status)) {
                locname = NULL;
            } else {
                // put the name info into the trie
                GNameInfo *nameinfo = (ZNameInfo *)uprv_malloc(sizeof(GNameInfo));
                if (nameinfo != NULL) {
                    nameinfo->type = UTZGNM_LOCATION;
                    nameinfo->tzID = cacheID;
                    fGNamesTrie.put(locname, nameinfo, status);
                }
            }
        }
    }

    return locname;
}